

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image2D.h
# Opt level: O3

void __thiscall Image2D::Image2D(Image2D *this)

{
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  std::ofstream::ofstream((ofstream *)&this->m_ofstream);
  return;
}

Assistant:

explicit Image2D() {}